

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

void __thiscall
ctemplate::TemplateCache::RefcountedTemplate::~RefcountedTemplate(RefcountedTemplate *this)

{
  if (this->ptr_ != (Template *)0x0) {
    (*this->ptr_->_vptr_Template[1])();
  }
  if ((this->mutex_).mutex_ == 0) {
    return;
  }
  __assert_fail("mutex_ == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                ,0xe9,"ctemplate::Mutex::~Mutex()");
}

Assistant:

~RefcountedTemplate() { delete ptr_; }